

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasSetColor(uchar red,uchar green,uchar blue,Canvas *ptr)

{
  if (ptr != (Canvas *)0x0) {
    ptr->color[0] = (float)red / 255.0;
    ptr->color[1] = (float)green / 255.0;
    ptr->color[2] = (float)blue / 255.0;
    ptr->color[3] = 1.0;
    return;
  }
  nullcThrowError("ERROR: Canvas object is nullptr");
  return;
}

Assistant:

void CanvasSetColor(unsigned char red, unsigned char green, unsigned char blue, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		ptr->color[0] = red / 255.0f;
		ptr->color[1] = green / 255.0f;
		ptr->color[2] = blue / 255.0f;
		ptr->color[3] = 1.0f;
	}